

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::InitializeValidityMask
               (data_ptr_t *row_locations,idx_t append_count,idx_t validity_bytes)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  
  switch(validity_bytes) {
  case 1:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        *row_locations[iVar2] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 2:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 3:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[2] = 0xff;
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 4:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        pdVar1[2] = 0xff;
        pdVar1[3] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 5:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[4] = 0xff;
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        pdVar1[2] = 0xff;
        pdVar1[3] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 6:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[4] = 0xff;
        pdVar1[5] = 0xff;
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        pdVar1[2] = 0xff;
        pdVar1[3] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 7:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[3] = 0xff;
        pdVar1[4] = 0xff;
        pdVar1[5] = 0xff;
        pdVar1[6] = 0xff;
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        pdVar1[2] = 0xff;
        pdVar1[3] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  case 8:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        pdVar1 = row_locations[iVar2];
        pdVar1[0] = 0xff;
        pdVar1[1] = 0xff;
        pdVar1[2] = 0xff;
        pdVar1[3] = 0xff;
        pdVar1[4] = 0xff;
        pdVar1[5] = 0xff;
        pdVar1[6] = 0xff;
        pdVar1[7] = 0xff;
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
    break;
  default:
    if (append_count != 0) {
      iVar2 = 0;
      do {
        FastMemset(row_locations[iVar2],-1,validity_bytes);
        iVar2 = iVar2 + 1;
      } while (append_count != iVar2);
    }
  }
  return;
}

Assistant:

static void InitializeValidityMask(const data_ptr_t row_locations[], const idx_t append_count,
                                   const idx_t validity_bytes) {
	switch (validity_bytes) {
	case 1:
		TemplatedInitializeValidityMask<uint8_t>(row_locations, append_count);
		break;
	case 2:
		TemplatedInitializeValidityMask<uint16_t>(row_locations, append_count);
		break;
	case 3:
		TemplatedInitializeValidityMask<3>(row_locations, append_count);
		break;
	case 4:
		TemplatedInitializeValidityMask<uint32_t>(row_locations, append_count);
		break;
	case 5:
		TemplatedInitializeValidityMask<5>(row_locations, append_count);
		break;
	case 6:
		TemplatedInitializeValidityMask<6>(row_locations, append_count);
		break;
	case 7:
		TemplatedInitializeValidityMask<7>(row_locations, append_count);
		break;
	case 8:
		TemplatedInitializeValidityMask<uint64_t>(row_locations, append_count);
		break;
	default:
		for (idx_t i = 0; i < append_count; i++) {
			FastMemset(row_locations[i], ~0, validity_bytes);
		}
	}
}